

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

TextMarkerGenerator * google::protobuf::TextMarkerGenerator::CreateRandom(void)

{
  char *pcVar1;
  result_type_conflict rVar2;
  result_type_conflict rVar3;
  long lVar4;
  ulong uVar5;
  TextMarkerGenerator *in_RDI;
  result_type_conflict rVar6;
  Time TVar7;
  Time t;
  mt19937_64 random;
  uniform_int_distribution<unsigned_long> local_a00;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9f0;
  
  TVar7 = absl::lts_20250127::Now();
  t.rep_.rep_lo_ = TVar7.rep_.rep_lo_;
  t.rep_.rep_hi_.hi_ = 0;
  t.rep_.rep_hi_.lo_ = t.rep_.rep_lo_;
  local_9f0._M_x[0] = absl::lts_20250127::ToUnixMicros((lts_20250127 *)TVar7.rep_.rep_hi_,t);
  lVar4 = 1;
  uVar5 = local_9f0._M_x[0];
  do {
    uVar5 = (uVar5 >> 0x3e ^ uVar5) * 0x5851f42d4c957f2d + lVar4;
    local_9f0._M_x[lVar4] = uVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x138);
  local_9f0._M_p = 0x138;
  local_a00._M_param._M_a = 0;
  local_a00._M_param._M_b = 2;
  rVar2 = std::uniform_int_distribution<unsigned_long>::operator()
                    (&local_a00,&local_9f0,&local_a00._M_param);
  local_a00._M_param._M_a = 1;
  local_a00._M_param._M_b = 3;
  rVar3 = std::uniform_int_distribution<unsigned_long>::operator()
                    (&local_a00,&local_9f0,&local_a00._M_param);
  pcVar1 = kRedactionMarkers[rVar2]._M_str;
  rVar6 = 3;
  if (rVar3 < 3) {
    rVar6 = rVar3;
  }
  (in_RDI->redaction_marker_)._M_len = kRedactionMarkers[rVar2]._M_len;
  (in_RDI->redaction_marker_)._M_str = pcVar1;
  (in_RDI->random_marker_)._M_len = rVar6;
  (in_RDI->random_marker_)._M_str = "   ";
  return in_RDI;
}

Assistant:

TextMarkerGenerator TextMarkerGenerator::CreateRandom() {
  // We avoid using sources backed by system entropy to allow the marker
  // generator to work in sandboxed environments that have no access to syscalls
  // such as getrandom or getpid. Note that this randomization has no security
  // implications, it's only used to break code that attempts to deserialize
  // debug strings.
  std::mt19937_64 random{
      static_cast<uint64_t>(absl::ToUnixMicros(absl::Now()))};

  size_t redaction_marker_index = std::uniform_int_distribution<size_t>{
      0, ABSL_ARRAYSIZE(kRedactionMarkers) - 1}(random);

  size_t random_marker_size =
      std::uniform_int_distribution<size_t>{1, kRandomMarker.size()}(random);

  return TextMarkerGenerator(kRedactionMarkers[redaction_marker_index],
                             kRandomMarker.substr(0, random_marker_size));
}